

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

Sequence ** __thiscall
testing::internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
          (ThreadLocal<testing::Sequence_*> *this)

{
  ValueHolder *pVVar1;
  ostream *poVar2;
  GTestLog local_48;
  int local_44;
  ValueHolder *pVStack_40;
  int gtest_error;
  ThreadLocalValueHolderBase *holder_base;
  ValueHolder *local_28;
  ValueHolder *new_holder;
  ThreadLocalValueHolderBase *holder;
  ThreadLocal<testing::Sequence_*> *this_local;
  
  holder = (ThreadLocalValueHolderBase *)this;
  new_holder = (ValueHolder *)pthread_getspecific(this->key_);
  if (new_holder == (ValueHolder *)0x0) {
    pVVar1 = (ValueHolder *)operator_new(0x10);
    ValueHolder::ValueHolder(pVVar1,&this->default_);
    pVStack_40 = pVVar1;
    local_28 = pVVar1;
    local_44 = pthread_setspecific(this->key_,pVVar1);
    if (local_44 != 0) {
      GTestLog::GTestLog(&local_48,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/./gtest/gtest.h"
                         ,0x8a7);
      poVar2 = GTestLog::GetStream(&local_48);
      poVar2 = std::operator<<(poVar2,"pthread_setspecific(key_, holder_base)");
      poVar2 = std::operator<<(poVar2,"failed with error ");
      std::ostream::operator<<(poVar2,local_44);
      GTestLog::~GTestLog(&local_48);
    }
    this_local = (ThreadLocal<testing::Sequence_*> *)ValueHolder::pointer(local_28);
  }
  else {
    pVVar1 = CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::Sequence*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
                       ((ThreadLocalValueHolderBase *)new_holder);
    this_local = (ThreadLocal<testing::Sequence_*> *)ValueHolder::pointer(pVVar1);
  }
  return (Sequence **)this_local;
}

Assistant:

T* GetOrCreateValue() const {
    ThreadLocalValueHolderBase* const holder =
        static_cast<ThreadLocalValueHolderBase*>(pthread_getspecific(key_));
    if (holder != NULL) {
      return CheckedDowncastToActualType<ValueHolder>(holder)->pointer();
    }

    ValueHolder* const new_holder = new ValueHolder(default_);
    ThreadLocalValueHolderBase* const holder_base = new_holder;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_setspecific(key_, holder_base));
    return new_holder->pointer();
  }